

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Spc_Emu::play_(Spc_Emu *this,long count,sample_t_conflict1 *out)

{
  sample_t_conflict1 **ppsVar1;
  sample_t_conflict1 *out_00;
  blargg_err_t pcVar2;
  ssize_t sVar3;
  size_t in_RCX;
  ulong uVar4;
  ulong uVar5;
  long count_00;
  
  if ((this->super_Music_Emu).sample_rate_ == 32000) {
    pcVar2 = play_and_filter(this,count,out);
    return pcVar2;
  }
  if (0 < count) {
    uVar4 = count;
    do {
      sVar3 = Fir_Resampler<24>::read
                        (&this->resampler,(int)out + ((int)count - (int)uVar4) * 2,
                         (void *)(uVar4 & 0xffffffff),in_RCX);
      uVar5 = uVar4 - (long)(int)sVar3;
      if (uVar5 != 0 && (long)(int)sVar3 <= (long)uVar4) {
        out_00 = (this->resampler).super_Fir_Resampler_.write_pos;
        count_00 = (long)(int)((long)(this->resampler).super_Fir_Resampler_.buf.begin_ +
                               ((this->resampler).super_Fir_Resampler_.buf.size_ * 2 - (long)out_00)
                              >> 1);
        pcVar2 = play_and_filter(this,count_00,out_00);
        if (pcVar2 != (blargg_err_t)0x0) {
          return pcVar2;
        }
        ppsVar1 = &(this->resampler).super_Fir_Resampler_.write_pos;
        *ppsVar1 = *ppsVar1 + count_00;
      }
      uVar4 = uVar5;
    } while (0 < (long)uVar5);
  }
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Spc_Emu::play_( long count, sample_t* out )
{
	if ( sample_rate() == native_sample_rate )
		return play_and_filter( count, out );
	
	long remain = count;
	while ( remain > 0 )
	{
		remain -= resampler.read( &out [count - remain], remain );
		if ( remain > 0 )
		{
			long n = resampler.max_write();
			RETURN_ERR( play_and_filter( n, resampler.buffer() ) );
			resampler.write( n );
		}
	}
	check( remain == 0 );
	return 0;
}